

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void duckdb_parquet::swap(SchemaElement *a,SchemaElement *b)

{
  LogicalType *in_RSI;
  long in_RDI;
  LogicalType *in_stack_ffffffffffffffe8;
  
  std::swap<duckdb_parquet::Type::type>((type *)(in_RDI + 8),(type *)&in_RSI->STRING);
  std::swap<int>((int *)(in_RDI + 0xc),(int *)&(in_RSI->STRING).field_0x4);
  std::swap<duckdb_parquet::FieldRepetitionType::type>((type *)(in_RDI + 0x10),(type *)&in_RSI->MAP)
  ;
  std::swap<char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffe8);
  std::swap<int>((int *)(in_RDI + 0x38),(int *)&in_RSI->DATE);
  std::swap<duckdb_parquet::ConvertedType::type>
            ((type *)(in_RDI + 0x3c),(type *)&(in_RSI->DATE).field_0x4);
  std::swap<int>((int *)(in_RDI + 0x40),(int *)&in_RSI->TIME);
  std::swap<int>((int *)(in_RDI + 0x44),(int *)&(in_RSI->TIME).field_0x4);
  std::swap<int>((int *)(in_RDI + 0x48),(int *)&(in_RSI->TIME).isAdjustedToUTC);
  swap(in_RSI,in_stack_ffffffffffffffe8);
  std::swap<duckdb_parquet::_SchemaElement__isset>
            ((_SchemaElement__isset *)(in_RDI + 0x140),(_SchemaElement__isset *)&in_RSI[1].TIME.unit
            );
  return;
}

Assistant:

void swap(SchemaElement &a, SchemaElement &b) {
  using ::std::swap;
  swap(a.type, b.type);
  swap(a.type_length, b.type_length);
  swap(a.repetition_type, b.repetition_type);
  swap(a.name, b.name);
  swap(a.num_children, b.num_children);
  swap(a.converted_type, b.converted_type);
  swap(a.scale, b.scale);
  swap(a.precision, b.precision);
  swap(a.field_id, b.field_id);
  swap(a.logicalType, b.logicalType);
  swap(a.__isset, b.__isset);
}